

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_4,_4>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_4,_4>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Matrix<float,_4,_4>_> *variable;
  Expr<tcu::Matrix<float,_4,_4>_> *pEVar1;
  IVal *this_01;
  IVal local_1a0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
               .m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_1a0,pEVar1,ctx);
    Environment::bind<tcu::Matrix<float,4,4>>(this_00,variable,&local_1a0);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_1a0,pEVar1,ctx);
    this_01 = Environment::lookup<tcu::Matrix<float,4,4>>
                        (ctx->env,(this->m_variable).
                                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                                  .m_ptr);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=(this_01,&local_1a0);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}